

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O0

bool Function_Template::form1_Invert(InvertForm1 Invert)

{
  byte bVar1;
  code *in_RDI;
  Image output;
  Image input;
  uint8_t intensity;
  uint8_t in_stack_ffffffffffffff4f;
  undefined6 in_stack_ffffffffffffff50;
  uint8_t in_stack_ffffffffffffff56;
  uint8_t in_stack_ffffffffffffff57;
  Image *in_stack_ffffffffffffff68;
  uint32_t in_stack_ffffffffffffff74;
  uint32_t in_stack_ffffffffffffff78;
  uint8_t in_stack_ffffffffffffff7f;
  ImageTemplate<unsigned_char> local_60;
  undefined1 local_38 [47];
  byte local_9;
  code *local_8;
  
  local_8 = in_RDI;
  local_9 = Unit_Test::intensityValue();
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            (&local_60,0,(uint)local_9,in_stack_ffffffffffffff57,in_stack_ffffffffffffff56);
  Test_Helper::uniformImage
            (in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
             in_stack_ffffffffffffff68);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1d89ff);
  (*local_8)(&stack0xffffffffffffff68,local_38);
  bVar1 = Unit_Test::verifyImage
                    ((Image *)CONCAT17(in_stack_ffffffffffffff57,
                                       CONCAT16(in_stack_ffffffffffffff56,in_stack_ffffffffffffff50)
                                      ),in_stack_ffffffffffffff4f);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1d8a40);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1d8a4d);
  return (bool)(bVar1 & 1);
}

Assistant:

bool form1_Invert(InvertForm1 Invert)
    {
        const uint8_t intensity = intensityValue();
        const PenguinV_Image::Image input = uniformImage( intensity );

        const PenguinV_Image::Image output = Invert( input );

        return verifyImage( output, ~intensity );
    }